

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

BOOL GetProcessTimes(HANDLE hProcess,LPFILETIME lpCreationTime,LPFILETIME lpExitTime,
                    LPFILETIME lpKernelTime,LPFILETIME lpUserTime)

{
  DWORD DVar1;
  DWORD DVar2;
  int iVar3;
  BOOL BVar4;
  undefined1 local_b8 [8];
  rusage resUsage;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0013fa3f;
  DVar1 = PROCGetProcessIDFromHandle(hProcess);
  DVar2 = GetCurrentProcessId();
  if (DVar1 == DVar2) {
    iVar3 = getrusage(RUSAGE_SELF,(rusage *)local_b8);
    if (iVar3 == -1) {
      fprintf(_stderr,"] %s %s:%d","GetProcessTimes",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x562);
      fprintf(_stderr,"Unable to get resource usage information for the current process\n");
      DVar1 = 0x54f;
      goto LAB_0013fa21;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013fa3f;
    if (lpUserTime != (LPFILETIME)0x0) {
      *lpUserTime = (_FILETIME)
                    ((resUsage.ru_utime.tv_sec * 1000 + (long)local_b8 * 1000000000) / 100);
    }
    BVar4 = 1;
    if (lpKernelTime != (LPFILETIME)0x0) {
      *lpKernelTime =
           (_FILETIME)
           ((resUsage.ru_stime.tv_sec * 1000 + resUsage.ru_utime.tv_usec * 1000000000) / 100);
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","GetProcessTimes",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x558);
    fprintf(_stderr,"GetProcessTimes() does not work on a process other than the current process.\n"
           );
    DVar1 = 6;
LAB_0013fa21:
    BVar4 = 0;
    SetLastError(DVar1);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar4;
  }
LAB_0013fa3f:
  abort();
}

Assistant:

BOOL
PALAPI
GetProcessTimes(
        IN HANDLE hProcess,
        OUT LPFILETIME lpCreationTime,
        OUT LPFILETIME lpExitTime,
        OUT LPFILETIME lpKernelTime,
        OUT LPFILETIME lpUserTime)
{
    BOOL retval = FALSE;
    struct rusage resUsage;
    __int64 calcTime;
    const __int64 SECS_TO_NS = 1000000000; /* 10^9 */
    const __int64 USECS_TO_NS = 1000;      /* 10^3 */


    PERF_ENTRY(GetProcessTimes);
    ENTRY("GetProcessTimes(hProcess=%p, lpExitTime=%p, lpKernelTime=%p,"
          "lpUserTime=%p)\n",
          hProcess, lpCreationTime, lpExitTime, lpKernelTime, lpUserTime );

    /* Make sure hProcess is the current process, this is the only supported
       case */
    if(PROCGetProcessIDFromHandle(hProcess)!=GetCurrentProcessId())
    {
        ASSERT("GetProcessTimes() does not work on a process other than the "
              "current process.\n");
        SetLastError(ERROR_INVALID_HANDLE);
        goto GetProcessTimesExit;
    }

    /* First, we need to actually retrieve the relevant statistics from the
       OS */
    if (getrusage (RUSAGE_SELF, &resUsage) == -1)
    {
        ASSERT("Unable to get resource usage information for the current "
              "process\n");
        SetLastError(ERROR_INTERNAL_ERROR);
        goto GetProcessTimesExit;
    }

    TRACE ("getrusage User: %ld sec,%ld microsec. Kernel: %ld sec,%ld"
           " microsec\n",
           resUsage.ru_utime.tv_sec, resUsage.ru_utime.tv_usec,
           resUsage.ru_stime.tv_sec, resUsage.ru_stime.tv_usec);

    if (lpUserTime)
    {
        /* Get the time of user mode execution, in 100s of nanoseconds */
        calcTime = (__int64)resUsage.ru_utime.tv_sec * SECS_TO_NS;
        calcTime += (__int64)resUsage.ru_utime.tv_usec * USECS_TO_NS;
        calcTime /= 100; /* Produce the time in 100s of ns */
        /* Assign the time into lpUserTime */
        lpUserTime->dwLowDateTime = (DWORD)calcTime;
        lpUserTime->dwHighDateTime = (DWORD)(calcTime >> 32);
    }

    if (lpKernelTime)
    {
        /* Get the time of kernel mode execution, in 100s of nanoseconds */
        calcTime = (__int64)resUsage.ru_stime.tv_sec * SECS_TO_NS;
        calcTime += (__int64)resUsage.ru_stime.tv_usec * USECS_TO_NS;
        calcTime /= 100; /* Produce the time in 100s of ns */
        /* Assign the time into lpUserTime */
        lpKernelTime->dwLowDateTime = (DWORD)calcTime;
        lpKernelTime->dwHighDateTime = (DWORD)(calcTime >> 32);
    }

    retval = TRUE;


GetProcessTimesExit:
    LOGEXIT("GetProcessTimes returns BOOL %d\n", retval);
    PERF_EXIT(GetProcessTimes);
    return (retval);
}